

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::TCPSocket::recvInWorker(TCPSocket *this)

{
  mutex *__mutex;
  list<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_> *this_00;
  int iVar1;
  _List_node_base *p_Var2;
  size_t __nbytes;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  rep rVar6;
  undefined1 auStack_98 [8];
  RecvCallback recvCallback;
  ErrorCallback errorCallback;
  undefined1 local_50 [8];
  shared_ptr<hwnet::TCPSocket> self;
  value_type front;
  
  recvCallback._M_invoker = (_Invoker_type)0x0;
  recvCallback.super__Function_base._M_functor._8_8_ = 0;
  recvCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  auStack_98 = (undefined1  [8])0x0;
  recvCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::TCPSocket,void>
            ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)local_50,
             (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<hwnet::TCPSocket>);
  __mutex = &this->mtx;
  std::mutex::lock(__mutex);
  std::
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  ::operator=((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
               *)auStack_98,&this->recvCallback_);
  this_00 = &this->recvList;
  p_Var2 = (this->recvList).
           super__List_base<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (((this->readable & p_Var2 != (_List_node_base *)this_00) == 0) &&
     ((this->socketError & 1U) == 0)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    if ((this->socketError & 1U) == 0) {
      std::__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> *)
                 &self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 1));
      std::__cxx11::
      list<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>::
      pop_front(this_00);
      iVar1 = this->readableVer;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      uVar3 = 0xffffffff;
      do {
        __nbytes._0_4_ =
             self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [1]._M_use_count;
        __nbytes._4_4_ =
             self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [1]._M_weak_count;
        sVar4 = read(this->fd,*(self.
                                super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base +
                              (long)self.
                                    super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi[1]._vptr__Sp_counted_base,__nbytes);
        if (sVar4 != -1) {
          uVar3 = (uint)sVar4;
          if (0 < (int)uVar3) {
            if (recvCallback.super__Function_base._M_functor._8_8_ != 0) {
              std::
              function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
              ::operator()((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
                            *)auStack_98,(shared_ptr<hwnet::TCPSocket> *)local_50,
                           (shared_ptr<hwnet::Buffer> *)
                           &self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(ulong)(uVar3 & 0x7fffffff));
            }
            std::mutex::lock(__mutex);
            if (this->recvTimeout != 0) {
              rVar6 = std::chrono::_V2::steady_clock::now();
              (this->lastRecvTime).__d.__r = rVar6;
            }
            goto LAB_0011ccdb;
          }
          break;
        }
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
      std::mutex::lock(__mutex);
      piVar5 = __errno_location();
      if (((int)uVar3 < 0) && (*piVar5 == 0xb)) {
        std::__cxx11::
        list<std::shared_ptr<hwnet::Buffer>,_std::allocator<std::shared_ptr<hwnet::Buffer>_>_>::
        push_front(this_00,(value_type *)
                           &self.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (iVar1 == this->readableVer) {
          this->readable = false;
        }
LAB_0011ccdb:
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&front);
        goto LAB_0011cd42;
      }
      this->err = *piVar5;
      this->socketError = true;
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator=
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                 &recvCallback._M_invoker,&this->errorCallback_);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&front);
    }
    else {
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator=
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                 &recvCallback._M_invoker,&this->errorCallback_);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    Close(this);
  }
LAB_0011cd42:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&self);
  std::_Function_base::~_Function_base((_Function_base *)auStack_98);
  std::_Function_base::~_Function_base((_Function_base *)&recvCallback._M_invoker);
  return;
}

Assistant:

void TCPSocket::recvInWorker() {

	ErrorCallback errorCallback = nullptr;
	RecvCallback  recvCallback  = nullptr;
	auto getError 				= false;
	auto self 					= shared_from_this();
	this->mtx.lock();
	recvCallback = this->recvCallback_;
	
	if(!this->canRead()){
		this->mtx.unlock();
	} else {
		if(this->socketError) {
			errorCallback = this->errorCallback_;
			this->mtx.unlock();
			getError = true;
		} else {		
			auto front = recvList.front();
			recvList.pop_front();
			auto localVer = this->readableVer;
			this->mtx.unlock();

#ifdef USE_SSL
			int n = 0;
			if(this->ssl) {
				n = SSLread(this->ssl,front->BuffPtr(),front->Len());
			} else {
				n = TEMP_FAILURE_RETRY(::read(this->fd,front->BuffPtr(),front->Len()));
			}
#else
			int n = TEMP_FAILURE_RETRY(::read(this->fd,front->BuffPtr(),front->Len()));

#endif

			if(n > 0) {

				if(recvCallback){
					recvCallback(self,front,n);			
				}

				this->mtx.lock();
				if(this->recvTimeout > 0) {
					this->lastRecvTime = std::chrono::steady_clock::now();
				}
				this->mtx.unlock();

			} else {
				this->mtx.lock();
				if(n < 0 && errno == EAGAIN) {					
					recvList.push_front(front);
					if(localVer == this->readableVer) {
						this->readable = false;
					}
				} else {
					getError = true;
					this->err = errno;
					this->socketError = true;
					errorCallback = this->errorCallback_;	
				}
				this->mtx.unlock();			
			}
		}

		if(getError) {
			if(errorCallback) {
				errorCallback(self,err);
			} else {
				this->Close();
			}		
		}
	}
}